

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3Fts5GetTokenizer
              (Fts5Global *pGlobal,char **azArg,int nArg,Fts5Tokenizer **ppTok,
              fts5_tokenizer **ppTokApi,char **pzErr)

{
  Fts5TokenizerModule *pFVar1;
  char *pcVar2;
  int iVar3;
  
  if (nArg == 0) {
    pcVar2 = (char *)0x0;
  }
  else {
    pcVar2 = *azArg;
  }
  pFVar1 = fts5LocateTokenizer(pGlobal,pcVar2);
  if (pFVar1 == (Fts5TokenizerModule *)0x0) {
    pcVar2 = sqlite3_mprintf("no such tokenizer: %s",*azArg);
    iVar3 = 1;
  }
  else {
    iVar3 = nArg + -1;
    if (nArg == 0) {
      iVar3 = 0;
    }
    iVar3 = (*(pFVar1->x).xCreate)(pFVar1->pUserData,azArg + 1,iVar3,ppTok);
    *ppTokApi = &pFVar1->x;
    if ((pzErr == (char **)0x0) || (iVar3 == 0)) goto LAB_001c7411;
    pcVar2 = sqlite3_mprintf("error in tokenizer constructor");
  }
  *pzErr = pcVar2;
LAB_001c7411:
  if (iVar3 != 0) {
    *ppTokApi = (fts5_tokenizer *)0x0;
    *ppTok = (Fts5Tokenizer *)0x0;
  }
  return iVar3;
}

Assistant:

static int sqlite3Fts5GetTokenizer(
  Fts5Global *pGlobal, 
  const char **azArg,
  int nArg,
  Fts5Tokenizer **ppTok,
  fts5_tokenizer **ppTokApi,
  char **pzErr
){
  Fts5TokenizerModule *pMod;
  int rc = SQLITE_OK;

  pMod = fts5LocateTokenizer(pGlobal, nArg==0 ? 0 : azArg[0]);
  if( pMod==0 ){
    assert( nArg>0 );
    rc = SQLITE_ERROR;
    *pzErr = sqlite3_mprintf("no such tokenizer: %s", azArg[0]);
  }else{
    rc = pMod->x.xCreate(pMod->pUserData, &azArg[1], (nArg?nArg-1:0), ppTok);
    *ppTokApi = &pMod->x;
    if( rc!=SQLITE_OK && pzErr ){
      *pzErr = sqlite3_mprintf("error in tokenizer constructor");
    }
  }

  if( rc!=SQLITE_OK ){
    *ppTokApi = 0;
    *ppTok = 0;
  }

  return rc;
}